

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cxx
# Opt level: O3

void __thiscall glauber::Output::Output(Output *this,VarMap *var_map)

{
  pointer *ppfVar1;
  undefined1 auVar2 [16];
  pointer pcVar3;
  pointer pfVar4;
  _Manager_type p_Var5;
  undefined8 uVar6;
  bool bVar7;
  char cVar8;
  any *paVar9;
  int *piVar10;
  bool *pbVar11;
  long lVar12;
  pointer pfVar13;
  const_iterator cVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  char **ppcVar15;
  runtime_error *prVar16;
  long *plVar17;
  size_type sVar18;
  function<void_(int,_double,_const_glauber::Event_&)> *pfVar19;
  pointer pfVar20;
  size_type *psVar21;
  anon_class_40_2_a59befe2 *__args;
  anon_class_40_2_a59befe2 *extraout_RDX;
  anon_class_40_2_a59befe2 *extraout_RDX_00;
  anon_class_40_2_a59befe2 *__args_00;
  int iVar22;
  function<void_(int,_double,_const_glauber::Event_&)> *__cur_1;
  pointer pfVar23;
  function<void_(int,_double,_const_glauber::Event_&)> *__cur;
  function<void_(int,_double,_const_glauber::Event_&)> *pfVar24;
  double dVar25;
  undefined8 extraout_XMM1_Qa;
  undefined1 extraout_var [56];
  undefined1 local_88 [16];
  undefined1 auStack_78 [16];
  int local_68 [4];
  pointer local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 auVar27 [64];
  undefined1 auVar26 [16];
  
  (this->writers_).
  super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->writers_).
  super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->writers_).
  super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._0_8_ = auStack_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"number-events","");
  paVar9 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
  piVar10 = boost::any_cast<int_const&>(paVar9);
  iVar22 = *piVar10;
  if ((undefined1 *)local_88._0_8_ != auStack_78) {
    operator_delete((void *)local_88._0_8_);
  }
  dVar25 = log10((double)iVar22);
  local_88._0_8_ = auStack_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"quiet","");
  paVar9 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
  auVar27._8_56_ = extraout_var;
  auVar27._0_8_ = extraout_XMM1_Qa;
  auVar26 = auVar27._0_16_;
  pbVar11 = boost::any_cast<bool_const&>(paVar9);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = dVar25;
  auVar2 = vroundsd_avx(auVar26,auVar2,10);
  bVar7 = *pbVar11;
  if ((undefined1 *)local_88._0_8_ != auStack_78) {
    operator_delete((void *)local_88._0_8_);
  }
  iVar22 = (int)auVar2._0_8_;
  if (bVar7 == false) {
    pfVar23 = (this->writers_).
              super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pfVar23 ==
        (this->writers_).
        super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      sVar18 = std::
               vector<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
               ::_M_check_len(&this->writers_,1,"vector::_M_realloc_insert");
      local_58 = (this->writers_).
                 super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pfVar4 = (this->writers_).
               super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (sVar18 == 0) {
        pfVar19 = (function<void_(int,_double,_const_glauber::Event_&)> *)0x0;
      }
      else {
        pfVar19 = __gnu_cxx::
                  new_allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>::
                  allocate((new_allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>
                            *)this,sVar18,(void *)0x0);
      }
      lVar12 = (long)pfVar23 - (long)local_58 >> 5;
      *(undefined8 *)&pfVar19[lVar12].super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&pfVar19[lVar12].super__Function_base._M_functor + 8) = 0;
      *(int *)&pfVar19[lVar12].super__Function_base._M_functor = iVar22;
      pfVar19[lVar12]._M_invoker =
           std::
           _Function_handler<void_(int,_double,_const_glauber::Event_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jbernhard[P]glauber-model/src/output.cxx:190:7)>
           ::_M_invoke;
      pfVar19[lVar12].super__Function_base._M_manager =
           std::
           _Function_handler<void_(int,_double,_const_glauber::Event_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jbernhard[P]glauber-model/src/output.cxx:190:7)>
           ::_M_manager;
      pfVar24 = pfVar19;
      for (pfVar13 = local_58; pfVar13 != pfVar23; pfVar13 = pfVar13 + 1) {
        *(undefined8 *)&(pfVar24->super__Function_base)._M_functor = 0;
        *(undefined8 *)((long)&(pfVar24->super__Function_base)._M_functor + 8) = 0;
        (pfVar24->super__Function_base)._M_manager = (_Manager_type)0x0;
        pfVar24->_M_invoker = pfVar13->_M_invoker;
        p_Var5 = (pfVar13->super__Function_base)._M_manager;
        if (p_Var5 != (_Manager_type)0x0) {
          (pfVar24->super__Function_base)._M_functor = (pfVar13->super__Function_base)._M_functor;
          (pfVar24->super__Function_base)._M_manager = p_Var5;
          (pfVar13->super__Function_base)._M_manager = (_Manager_type)0x0;
          pfVar13->_M_invoker = (_Invoker_type)0x0;
        }
        pfVar24 = pfVar24 + 1;
      }
      for (; pfVar24 = pfVar24 + 1, pfVar4 != pfVar23; pfVar23 = pfVar23 + 1) {
        *(undefined8 *)&(pfVar24->super__Function_base)._M_functor = 0;
        *(undefined8 *)((long)&(pfVar24->super__Function_base)._M_functor + 8) = 0;
        (pfVar24->super__Function_base)._M_manager = (_Manager_type)0x0;
        pfVar24->_M_invoker = pfVar23->_M_invoker;
        p_Var5 = (pfVar23->super__Function_base)._M_manager;
        if (p_Var5 != (_Manager_type)0x0) {
          (pfVar24->super__Function_base)._M_functor = (pfVar23->super__Function_base)._M_functor;
          (pfVar24->super__Function_base)._M_manager = p_Var5;
          (pfVar23->super__Function_base)._M_manager = (_Manager_type)0x0;
          pfVar23->_M_invoker = (_Invoker_type)0x0;
        }
      }
      if (local_58 != (pointer)0x0) {
        operator_delete(local_58);
      }
      (this->writers_).
      super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pfVar19;
      (this->writers_).
      super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pfVar24;
      (this->writers_).
      super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pfVar19 + sVar18;
    }
    else {
      *(undefined8 *)&(pfVar23->super__Function_base)._M_functor = 0;
      *(undefined8 *)((long)&(pfVar23->super__Function_base)._M_functor + 8) = 0;
      *(int *)&(pfVar23->super__Function_base)._M_functor = iVar22;
      pfVar23->_M_invoker =
           std::
           _Function_handler<void_(int,_double,_const_glauber::Event_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jbernhard[P]glauber-model/src/output.cxx:190:7)>
           ::_M_invoke;
      (pfVar23->super__Function_base)._M_manager =
           std::
           _Function_handler<void_(int,_double,_const_glauber::Event_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jbernhard[P]glauber-model/src/output.cxx:190:7)>
           ::_M_manager;
      ppfVar1 = &(this->writers_).
                 super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppfVar1 = *ppfVar1 + 1;
    }
  }
  local_88._0_8_ = auStack_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"output","");
  cVar14 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)(var_map + 0x10),(key_type *)local_88);
  if ((undefined1 *)local_88._0_8_ != auStack_78) {
    operator_delete((void *)local_88._0_8_);
  }
  if (cVar14._M_node != (_Base_ptr)(var_map + 0x18)) {
    local_88._0_8_ = auStack_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"output","");
    paVar9 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
    __rhs = &boost::any_cast<boost::filesystem::path_const&>(paVar9)->m_pathname;
    if ((undefined1 *)local_88._0_8_ != auStack_78) {
      operator_delete((void *)local_88._0_8_);
    }
    bVar7 = boost::filesystem::path::has_extension((path *)__rhs);
    if (bVar7) {
      local_88._0_8_ = ".hdf5";
      local_88._8_8_ = ".hdf";
      auStack_78._0_8_ = ".hd5";
      auStack_78._8_8_ = ".h5";
      boost::filesystem::path::extension();
      ppcVar15 = std::
                 __find_if<char_const*const*,__gnu_cxx::__ops::_Iter_equals_val<boost::filesystem::path_const>>
                           (local_88,local_68,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (ppcVar15 != (char **)local_68) {
        prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar16,"HDF5 output was not compiled");
        __cxa_throw(prVar16,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    boost::filesystem::detail::status((path *)local_88,(error_code *)__rhs);
    if ((uint)local_88._0_4_ < 2) {
      boost::filesystem::detail::create_directories((path *)__rhs,(error_code *)0x0);
    }
    else {
      cVar8 = boost::filesystem::detail::is_empty((path *)__rhs,(error_code *)0x0);
      if (cVar8 == '\0') {
        prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_50,"output directory \'",__rhs);
        plVar17 = (long *)std::__cxx11::string::append((char *)&local_50);
        psVar21 = (size_type *)(plVar17 + 2);
        local_88._0_8_ = *plVar17;
        if ((size_type *)local_88._0_8_ == psVar21) {
          auStack_78._0_8_ = *psVar21;
          auStack_78._8_8_ = plVar17[3];
          local_88._0_8_ = auStack_78;
        }
        else {
          auStack_78._0_8_ = *psVar21;
        }
        local_88._8_8_ = plVar17[1];
        *plVar17 = (long)psVar21;
        plVar17[1] = 0;
        *(undefined1 *)(plVar17 + 2) = 0;
        std::runtime_error::runtime_error(prVar16,(string *)local_88);
        __cxa_throw(prVar16,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    local_88._0_8_ = auStack_78;
    pcVar3 = (__rhs->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,pcVar3,pcVar3 + __rhs->_M_string_length);
    pfVar23 = (this->writers_).
              super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_68[0] = iVar22;
    if (pfVar23 ==
        (this->writers_).
        super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      sVar18 = std::
               vector<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
               ::_M_check_len(&this->writers_,1,"vector::_M_realloc_insert");
      pfVar4 = (this->writers_).
               super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pfVar13 = (this->writers_).
                super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (sVar18 == 0) {
        pfVar19 = (function<void_(int,_double,_const_glauber::Event_&)> *)0x0;
        __args_00 = extraout_RDX;
      }
      else {
        pfVar19 = __gnu_cxx::
                  new_allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>::
                  allocate((new_allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>
                            *)this,sVar18,(void *)0x0);
        __args_00 = extraout_RDX_00;
      }
      std::allocator_traits<std::allocator<std::function<void(int,double,glauber::Event_const&)>>>::
      construct<std::function<void(int,double,glauber::Event_const&)>,glauber::Output::Output(boost::program_options::variables_map_const&)::__1>
                ((allocator_type *)(pfVar19 + ((long)pfVar23 - (long)pfVar4 >> 5)),
                 (function<void_(int,_double,_const_glauber::Event_&)> *)local_88,__args_00);
      pfVar24 = pfVar19;
      for (pfVar20 = pfVar4; pfVar20 != pfVar23; pfVar20 = pfVar20 + 1) {
        *(undefined8 *)&(pfVar24->super__Function_base)._M_functor = 0;
        *(undefined8 *)((long)&(pfVar24->super__Function_base)._M_functor + 8) = 0;
        (pfVar24->super__Function_base)._M_manager = (_Manager_type)0x0;
        pfVar24->_M_invoker = pfVar20->_M_invoker;
        p_Var5 = (pfVar20->super__Function_base)._M_manager;
        if (p_Var5 != (_Manager_type)0x0) {
          uVar6 = *(undefined8 *)((long)&(pfVar20->super__Function_base)._M_functor + 8);
          *(undefined8 *)&(pfVar24->super__Function_base)._M_functor =
               *(undefined8 *)&(pfVar20->super__Function_base)._M_functor;
          *(undefined8 *)((long)&(pfVar24->super__Function_base)._M_functor + 8) = uVar6;
          (pfVar24->super__Function_base)._M_manager = p_Var5;
          (pfVar20->super__Function_base)._M_manager = (_Manager_type)0x0;
          pfVar20->_M_invoker = (_Invoker_type)0x0;
        }
        pfVar24 = pfVar24 + 1;
      }
      for (; pfVar24 = pfVar24 + 1, pfVar13 != pfVar23; pfVar23 = pfVar23 + 1) {
        *(undefined8 *)&(pfVar24->super__Function_base)._M_functor = 0;
        *(undefined8 *)((long)&(pfVar24->super__Function_base)._M_functor + 8) = 0;
        (pfVar24->super__Function_base)._M_manager = (_Manager_type)0x0;
        pfVar24->_M_invoker = pfVar23->_M_invoker;
        p_Var5 = (pfVar23->super__Function_base)._M_manager;
        if (p_Var5 != (_Manager_type)0x0) {
          uVar6 = *(undefined8 *)((long)&(pfVar23->super__Function_base)._M_functor + 8);
          *(undefined8 *)&(pfVar24->super__Function_base)._M_functor =
               *(undefined8 *)&(pfVar23->super__Function_base)._M_functor;
          *(undefined8 *)((long)&(pfVar24->super__Function_base)._M_functor + 8) = uVar6;
          (pfVar24->super__Function_base)._M_manager = p_Var5;
          (pfVar23->super__Function_base)._M_manager = (_Manager_type)0x0;
          pfVar23->_M_invoker = (_Invoker_type)0x0;
        }
      }
      if (pfVar4 != (pointer)0x0) {
        operator_delete(pfVar4);
      }
      (this->writers_).
      super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pfVar19;
      (this->writers_).
      super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pfVar24;
      (this->writers_).
      super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pfVar19 + sVar18;
    }
    else {
      std::allocator_traits<std::allocator<std::function<void(int,double,glauber::Event_const&)>>>::
      construct<std::function<void(int,double,glauber::Event_const&)>,glauber::Output::Output(boost::program_options::variables_map_const&)::__1>
                ((allocator_type *)pfVar23,
                 (function<void_(int,_double,_const_glauber::Event_&)> *)local_88,__args);
      ppfVar1 = &(this->writers_).
                 super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppfVar1 = *ppfVar1 + 1;
    }
    if ((undefined1 *)local_88._0_8_ != auStack_78) {
      operator_delete((void *)local_88._0_8_);
    }
  }
  return;
}

Assistant:

Output::Output(const VarMap& var_map) {
  // Determine the required width (padding) of the event number.  For example if
  // there are 10 events, the numbers are 0-9 and so no padding is necessary.
  // However given 11 events, the numbers are 00-10 with padded 00, 01, ...
  auto nevents = var_map["number-events"].as<int>();
  auto width = static_cast<int>(std::ceil(std::log10(nevents)));

  // Write to stdout unless the quiet option was specified.
  if (!var_map["quiet"].as<bool>()) {
    writers_.emplace_back(
      [width](int num, double impact_param, const Event& event) {
        write_stream(std::cout, width, num, impact_param, event);
      }
    );
  }

  // Possibly write to text or HDF5 files.
  if (var_map.count("output")) {
    const auto& output_path = var_map["output"].as<fs::path>();
    if (is_hdf5(output_path)) {
#ifdef GLAUBER_HDF5
      if (fs::exists(output_path))
        throw std::runtime_error{"file '" + output_path.string() +
                                 "' exists, will not overwrite"};
      writers_.emplace_back(HDF5Writer{output_path});
#else
      throw std::runtime_error{"HDF5 output was not compiled"};
#endif  // GLAUBER_HDF5
    } else {
      // Text files are all written into a single directory.  Require the
      // directory to be initially empty to avoid accidental overwriting and/or
      // spewing files into an already-used location.  If the directory does not
      // exist, create it.
      if (fs::exists(output_path)) {
        if (!fs::is_empty(output_path)) {
          throw std::runtime_error{"output directory '" + output_path.string() +
                                   "' must be empty"};
        }
      } else {
        fs::create_directories(output_path);
      }
      writers_.emplace_back(
        [output_path, width](int num, double impact_param, const Event& event) {
          write_text_file(output_path, width, num, impact_param, event);
        }
      );
    }
  }
}